

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::port_filter_updated(torrent *this)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  undefined4 extraout_var;
  alert_manager *paVar3;
  reason_t local_11c;
  undefined1 local_118 [24];
  basic_endpoint<boost::asio::ip::tcp> *ep;
  iterator __end3;
  iterator __begin3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  banned;
  torrent_state st;
  torrent *this_local;
  
  st.erased.
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    get_peer_list_state((torrent_state *)
                        &banned.
                         super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              *)&stack0xffffffffffffff28);
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0xd])();
    peer_list::apply_port_filter
              (this_00,(port_filter *)CONCAT44(extraout_var,iVar2),
               (torrent_state *)
               &banned.
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                *)&stack0xffffffffffffff28);
    paVar3 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::peer_blocked_alert>(paVar3);
    if (bVar1) {
      __end3 = ::std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                        *)&stack0xffffffffffffff28);
      ep = (basic_endpoint<boost::asio::ip::tcp> *)
           ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ::end((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                  *)&stack0xffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                         *)&ep), bVar1) {
        local_118._16_8_ =
             __gnu_cxx::
             __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
             ::operator*(&__end3);
        paVar3 = alerts(this);
        get_handle((torrent *)local_118);
        local_11c = port_filter;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::peer_blocked_alert::reason_t>
                  (paVar3,(torrent_handle *)local_118,
                   (basic_endpoint<boost::asio::ip::tcp> *)local_118._16_8_,&local_11c);
        torrent_handle::~torrent_handle((torrent_handle *)local_118);
        __gnu_cxx::
        __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
        ::operator++(&__end3);
      }
    }
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::~vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               *)&stack0xffffffffffffff28);
    torrent_state::~torrent_state
              ((torrent_state *)
               &banned.
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void torrent::port_filter_updated()
	{
		if (!m_peer_list) return;

		torrent_state st = get_peer_list_state();
		std::vector<tcp::endpoint> banned;
		m_peer_list->apply_port_filter(m_ses.get_port_filter(), &st, banned);

		if (alerts().should_post<peer_blocked_alert>())
		{
			for (auto const& ep : banned)
				alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, ep, peer_blocked_alert::port_filter);
		}

		peers_erased(st.erased);
	}